

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  long lVar2;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000b8;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  this_00 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - int64);
  switch(this_00) {
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0:
    lVar2 = as_integer<long>(in_stack_000000b8);
    local_1 = -1 < lVar2;
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x1:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x6:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_const_reference_storage::value((json_const_reference_storage *)0x6761a6);
    local_1 = is_uint64(this_00);
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x7:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_reference_storage::value((json_reference_storage *)0x6761cf);
    local_1 = is_uint64(this_00);
  }
  return local_1;
}

Assistant:

bool is_uint64() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::uint64:
                    return true;
                case json_storage_kind::int64:
                    return as_integer<int64_t>() >= 0;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_uint64();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_uint64();
                default:
                    return false;
            }
        }